

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::Copy(aiLight **_dest,aiLight *src)

{
  aiLight *__dest;
  
  if (src == (aiLight *)0x0 || _dest == (aiLight **)0x0) {
    return;
  }
  __dest = (aiLight *)operator_new(0x46c);
  *_dest = __dest;
  memcpy(__dest,src,0x46c);
  return;
}

Assistant:

void SceneCombiner::Copy(aiLight** _dest, const aiLight* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiLight* dest = *_dest = new aiLight();

    // get a flat copy, that's already OK
    ::memcpy(dest,src,sizeof(aiLight));
}